

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlUTF8Strloc(xmlChar *utf,xmlChar *utfchar)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  ulong in_R8;
  int iVar8;
  
  iVar8 = -1;
  if (utfchar != (xmlChar *)0x0 && utf != (xmlChar *)0x0) {
    iVar3 = xmlUTF8Strsize(utfchar,1);
    bVar6 = *utf;
    if (bVar6 != 0) {
      uVar4 = 0;
      while ((0 < iVar3 && (utf != utfchar))) {
        lVar7 = 0;
        iVar8 = iVar3;
        do {
          pbVar1 = utfchar + lVar7;
          bVar2 = false;
          uVar5 = (uint)utf[lVar7] - (uint)*pbVar1;
          if (uVar5 == 0) {
            iVar8 = iVar8 + -1;
            if (iVar8 == 0) {
              iVar8 = 0;
              goto LAB_001d2299;
            }
            bVar2 = true;
          }
          else {
LAB_001d2299:
            in_R8 = (ulong)uVar5;
          }
          if (!bVar2) goto LAB_001d22bd;
          lVar7 = lVar7 + 1;
        } while (*pbVar1 != 0);
        in_R8 = 0;
LAB_001d22bd:
        if ((int)in_R8 == 0) break;
        utf = utf + 1;
        if ((char)bVar6 < '\0') {
          if ((~bVar6 & 0xc0) != 0) {
            return -1;
          }
          if ((bVar6 & 0x40) != 0) {
            return -1;
          }
        }
        uVar4 = uVar4 + 1;
        bVar6 = *utf;
        if (bVar6 == 0) {
          return -1;
        }
      }
      iVar8 = (int)uVar4;
      if (0x7fffffff < uVar4) {
        iVar8 = 0;
      }
    }
  }
  return iVar8;
}

Assistant:

int
xmlUTF8Strloc(const xmlChar *utf, const xmlChar *utfchar) {
    size_t i;
    int size;
    int ch;

    if (utf==NULL || utfchar==NULL) return -1;
    size = xmlUTF8Strsize(utfchar, 1);
        for(i=0; (ch=*utf) != 0; i++) {
            if (xmlStrncmp(utf, utfchar, size)==0)
                return(i > INT_MAX ? 0 : i);
            utf++;
            if ( ch & 0x80 ) {
                /* if not simple ascii, verify proper format */
                if ( (ch & 0xc0) != 0xc0 )
                    return(-1);
                /* then skip over remaining bytes for this char */
                while ( (ch <<= 1) & 0x80 )
                    if ( (*utf++ & 0xc0) != 0x80 )
                        return(-1);
            }
        }

    return(-1);
}